

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20.c
# Opt level: O0

void chacha20_encrypt_block(uint32_t *ctx,uint8_t *out,uint32_t incr,uint8_t *text)

{
  uint32_t uVar1;
  __uint32_t _Var2;
  uint32_t i_2;
  uint32_t x_31;
  uint32_t *os_31;
  uint32_t x_30;
  uint32_t *os_30;
  uint32_t x_29;
  uint32_t *os_29;
  uint32_t x_28;
  uint32_t *os_28;
  uint32_t x_27;
  uint32_t *os_27;
  uint32_t x_26;
  uint32_t *os_26;
  uint32_t x_25;
  uint32_t *os_25;
  uint32_t x_24;
  uint32_t *os_24;
  uint32_t x_23;
  uint32_t *os_23;
  uint32_t x_22;
  uint32_t *os_22;
  uint32_t x_21;
  uint32_t *os_21;
  uint32_t x_20;
  uint32_t *os_20;
  uint32_t x_19;
  uint32_t *os_19;
  uint32_t x_18;
  uint32_t *os_18;
  uint32_t x_17;
  uint32_t *os_17;
  uint32_t x_16;
  uint32_t *os_16;
  uint32_t i_1;
  uint32_t x_15;
  uint32_t r_15;
  uint32_t u_15;
  uint8_t *bj_15;
  uint32_t *os_15;
  uint32_t x_14;
  uint32_t r_14;
  uint32_t u_14;
  uint8_t *bj_14;
  uint32_t *os_14;
  uint32_t x_13;
  uint32_t r_13;
  uint32_t u_13;
  uint8_t *bj_13;
  uint32_t *os_13;
  uint32_t x_12;
  uint32_t r_12;
  uint32_t u_12;
  uint8_t *bj_12;
  uint32_t *os_12;
  uint32_t x_11;
  uint32_t r_11;
  uint32_t u_11;
  uint8_t *bj_11;
  uint32_t *os_11;
  uint32_t x_10;
  uint32_t r_10;
  uint32_t u_10;
  uint8_t *bj_10;
  uint32_t *os_10;
  uint32_t x_9;
  uint32_t r_9;
  uint32_t u_9;
  uint8_t *bj_9;
  uint32_t *os_9;
  uint32_t x_8;
  uint32_t r_8;
  uint32_t u_8;
  uint8_t *bj_8;
  uint32_t *os_8;
  uint32_t x_7;
  uint32_t r_7;
  uint32_t u_7;
  uint8_t *bj_7;
  uint32_t *os_7;
  uint32_t x_6;
  uint32_t r_6;
  uint32_t u_6;
  uint8_t *bj_6;
  uint32_t *os_6;
  uint32_t x_5;
  uint32_t r_5;
  uint32_t u_5;
  uint8_t *bj_5;
  uint32_t *os_5;
  uint32_t x_4;
  uint32_t r_4;
  uint32_t u_4;
  uint8_t *bj_4;
  uint32_t *os_4;
  uint32_t x_3;
  uint32_t r_3;
  uint32_t u_3;
  uint8_t *bj_3;
  uint32_t *os_3;
  uint32_t x_2;
  uint32_t r_2;
  uint32_t u_2;
  uint8_t *bj_2;
  uint32_t *os_2;
  uint32_t x_1;
  uint32_t r_1;
  uint32_t u_1;
  uint8_t *bj_1;
  uint32_t *os_1;
  uint32_t x;
  uint32_t r;
  uint32_t u;
  uint8_t *bj;
  uint32_t *os;
  __uint32_t local_a8;
  uint32_t i;
  uint32_t bl [16];
  uint32_t k [16];
  uint8_t *text_local;
  uint32_t incr_local;
  uint8_t *out_local;
  uint32_t *ctx_local;
  
  memset(bl + 0xe,0,0x40);
  chacha20_core(bl + 0xe,ctx,incr);
  memset(&local_a8,0,0x40);
  uVar1 = load32(text);
  local_a8 = __uint32_identity(uVar1);
  uVar1 = load32(text + 4);
  i = __uint32_identity(uVar1);
  uVar1 = load32(text + 8);
  bl[0] = __uint32_identity(uVar1);
  uVar1 = load32(text + 0xc);
  bl[1] = __uint32_identity(uVar1);
  uVar1 = load32(text + 0x10);
  bl[2] = __uint32_identity(uVar1);
  uVar1 = load32(text + 0x14);
  bl[3] = __uint32_identity(uVar1);
  uVar1 = load32(text + 0x18);
  bl[4] = __uint32_identity(uVar1);
  uVar1 = load32(text + 0x1c);
  bl[5] = __uint32_identity(uVar1);
  uVar1 = load32(text + 0x20);
  bl[6] = __uint32_identity(uVar1);
  uVar1 = load32(text + 0x24);
  bl[7] = __uint32_identity(uVar1);
  uVar1 = load32(text + 0x28);
  bl[8] = __uint32_identity(uVar1);
  uVar1 = load32(text + 0x2c);
  bl[9] = __uint32_identity(uVar1);
  uVar1 = load32(text + 0x30);
  bl[10] = __uint32_identity(uVar1);
  uVar1 = load32(text + 0x34);
  bl[0xb] = __uint32_identity(uVar1);
  uVar1 = load32(text + 0x38);
  bl[0xc] = __uint32_identity(uVar1);
  uVar1 = load32(text + 0x3c);
  _Var2 = __uint32_identity(uVar1);
  local_a8 = local_a8 ^ bl[0xe];
  i = i ^ bl[0xf];
  bl[0] = bl[0] ^ k[0];
  bl[1] = bl[1] ^ k[1];
  bl[2] = bl[2] ^ k[2];
  bl[3] = bl[3] ^ k[3];
  bl[4] = bl[4] ^ k[4];
  bl[5] = bl[5] ^ k[5];
  bl[6] = bl[6] ^ k[6];
  bl[7] = bl[7] ^ k[7];
  bl[8] = bl[8] ^ k[8];
  bl[9] = bl[9] ^ k[9];
  bl[10] = bl[10] ^ k[10];
  bl[0xb] = bl[0xb] ^ k[0xb];
  bl[0xc] = bl[0xc] ^ k[0xc];
  bl[0xd] = _Var2 ^ k[0xd];
  _Var2 = __uint32_identity(local_a8);
  store32(out,_Var2);
  _Var2 = __uint32_identity(i);
  store32(out + 4,_Var2);
  _Var2 = __uint32_identity(bl[0]);
  store32(out + 8,_Var2);
  _Var2 = __uint32_identity(bl[1]);
  store32(out + 0xc,_Var2);
  _Var2 = __uint32_identity(bl[2]);
  store32(out + 0x10,_Var2);
  _Var2 = __uint32_identity(bl[3]);
  store32(out + 0x14,_Var2);
  _Var2 = __uint32_identity(bl[4]);
  store32(out + 0x18,_Var2);
  _Var2 = __uint32_identity(bl[5]);
  store32(out + 0x1c,_Var2);
  _Var2 = __uint32_identity(bl[6]);
  store32(out + 0x20,_Var2);
  _Var2 = __uint32_identity(bl[7]);
  store32(out + 0x24,_Var2);
  _Var2 = __uint32_identity(bl[8]);
  store32(out + 0x28,_Var2);
  _Var2 = __uint32_identity(bl[9]);
  store32(out + 0x2c,_Var2);
  _Var2 = __uint32_identity(bl[10]);
  store32(out + 0x30,_Var2);
  _Var2 = __uint32_identity(bl[0xb]);
  store32(out + 0x34,_Var2);
  _Var2 = __uint32_identity(bl[0xc]);
  store32(out + 0x38,_Var2);
  _Var2 = __uint32_identity(bl[0xd]);
  store32(out + 0x3c,_Var2);
  return;
}

Assistant:

static void chacha20_encrypt_block(uint32_t *ctx, uint8_t *out, uint32_t incr, uint8_t *text)
{
  uint32_t k[16U] = { 0U };
  chacha20_core(k, ctx, incr);
  uint32_t bl[16U] = { 0U };
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    uint32_t *os = bl;
    uint8_t *bj = text + i * 4U;
    uint32_t u = load32_le(bj);
    uint32_t r = u;
    uint32_t x = r;
    os[i] = x;);
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    uint32_t *os = bl;
    uint32_t x = bl[i] ^ k[i];
    os[i] = x;);
  KRML_MAYBE_FOR16(i, 0U, 16U, 1U, store32_le(out + i * 4U, bl[i]););
}